

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_metric.c
# Opt level: O0

REF_STATUS
add_sub_tet(REF_INT n0,REF_INT n1,REF_INT n2,REF_INT n3,REF_INT *nodes,REF_DBL *metric,
           REF_DBL *total_node_volume,REF_NODE ref_node,REF_CELL ref_cell)

{
  int iVar1;
  REF_STATUS RVar2;
  uint uVar3;
  int iVar4;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_STATUS status;
  REF_INT im;
  REF_INT node;
  REF_DBL tet_volume;
  REF_DBL log_m [6];
  REF_DBL m [6];
  REF_INT tet_nodes [27];
  REF_DBL *metric_local;
  REF_INT *nodes_local;
  REF_INT n3_local;
  REF_INT n2_local;
  REF_INT n1_local;
  REF_INT n0_local;
  
  m[5]._0_4_ = nodes[n0];
  m[5]._4_4_ = nodes[n1];
  iVar4 = nodes[n2];
  iVar1 = nodes[n3];
  n1_local = ref_node_tet_vol(ref_node,(REF_INT *)(m + 5),(REF_DBL *)&im);
  if (n1_local == 0) {
    RVar2 = ref_matrix_imply_m(log_m + 5,ref_node->real + m[5]._0_4_ * 0xf,
                               ref_node->real + m[5]._4_4_ * 0xf,ref_node->real + iVar4 * 0xf,
                               ref_node->real + iVar1 * 0xf);
    if ((0.0 < _im) && (RVar2 == 0)) {
      uVar3 = ref_matrix_log_m(log_m + 5,&tet_volume);
      if (uVar3 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
               0x600,"add_sub_tet",(ulong)uVar3,"log");
        return uVar3;
      }
      for (status = 0; status < ref_cell->node_per; status = status + 1) {
        total_node_volume[nodes[status]] = _im + total_node_volume[nodes[status]];
        for (ref_private_macro_code_rss = 0; ref_private_macro_code_rss < 6;
            ref_private_macro_code_rss = ref_private_macro_code_rss + 1) {
          iVar4 = ref_private_macro_code_rss + nodes[status] * 6;
          metric[iVar4] = _im * log_m[(long)ref_private_macro_code_rss + -1] + metric[iVar4];
        }
      }
    }
    n1_local = 0;
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",0x5fa,
           "add_sub_tet",(ulong)(uint)n1_local,"vol");
  }
  return n1_local;
}

Assistant:

static REF_STATUS add_sub_tet(REF_INT n0, REF_INT n1, REF_INT n2, REF_INT n3,
                              REF_INT *nodes, REF_DBL *metric,
                              REF_DBL *total_node_volume, REF_NODE ref_node,
                              REF_CELL ref_cell) {
  REF_INT tet_nodes[REF_CELL_MAX_SIZE_PER];
  REF_DBL m[6], log_m[6];
  REF_DBL tet_volume;
  REF_INT node, im;
  REF_STATUS status;
  tet_nodes[0] = nodes[(n0)];
  tet_nodes[1] = nodes[(n1)];
  tet_nodes[2] = nodes[(n2)];
  tet_nodes[3] = nodes[(n3)];
  RSS(ref_node_tet_vol(ref_node, tet_nodes, &tet_volume), "vol");
  status = ref_matrix_imply_m(m, ref_node_xyz_ptr(ref_node, tet_nodes[0]),
                              ref_node_xyz_ptr(ref_node, tet_nodes[1]),
                              ref_node_xyz_ptr(ref_node, tet_nodes[2]),
                              ref_node_xyz_ptr(ref_node, tet_nodes[3]));
  if (tet_volume > 0.0 && REF_SUCCESS == status) {
    RSS(ref_matrix_log_m(m, log_m), "log");
    for (node = 0; node < ref_cell_node_per(ref_cell); node++) {
      total_node_volume[nodes[node]] += tet_volume;
      for (im = 0; im < 6; im++)
        metric[im + 6 * nodes[node]] += tet_volume * log_m[im];
    }
  } else {
    /* silently skip singular contribution */
  }

  return REF_SUCCESS;
}